

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

void mbedtls_debug_print_mpi
               (mbedtls_ssl_context *ssl,int level,char *file,int line,char *text,mbedtls_mpi *X)

{
  size_t sVar1;
  ulong uVar2;
  uchar octet;
  size_t offset_in_limb;
  size_t limb_offset;
  ulong uStack_248;
  int n;
  size_t idx;
  size_t bitlen;
  char str [512];
  mbedtls_mpi *X_local;
  char *text_local;
  int line_local;
  char *file_local;
  int level_local;
  mbedtls_ssl_context *ssl_local;
  
  uStack_248 = 0;
  if ((((ssl != (mbedtls_ssl_context *)0x0) && (ssl->conf != (mbedtls_ssl_config *)0x0)) &&
      (ssl->conf->f_dbg != (_func_void_void_ptr_int_char_ptr_int_char_ptr *)0x0)) &&
     ((X != (mbedtls_mpi *)0x0 && (level <= debug_threshold)))) {
    str._504_8_ = X;
    sVar1 = mbedtls_mpi_bitlen(X);
    snprintf((char *)&bitlen,0x200,"value of \'%s\' (%u bits) is:\n",text,sVar1 & 0xffffffff);
    debug_send_line(ssl,level,file,line,(char *)&bitlen);
    if (sVar1 == 0) {
      bitlen._0_1_ = 0x20;
      bitlen._1_1_ = 0x30;
      bitlen._2_1_ = 0x30;
      uStack_248 = 3;
    }
    else {
      for (limb_offset._4_4_ = (int)(sVar1 - 1 >> 3); -1 < limb_offset._4_4_;
          limb_offset._4_4_ = limb_offset._4_4_ + -1) {
        snprintf(str + (uStack_248 - 8),0x200 - uStack_248," %02x",
                 *(ulong *)(*(long *)str._504_8_ + ((long)limb_offset._4_4_ & 0xfffffffffffffff8U))
                 >> (sbyte)(((long)limb_offset._4_4_ & 7U) << 3) & 0xff);
        uVar2 = uStack_248 + 3;
        if (0x2f < uVar2) {
          snprintf(str + (uStack_248 - 5),0x200 - uVar2,"\n");
          debug_send_line(ssl,level,file,line,(char *)&bitlen);
          uStack_248 = 0;
          uVar2 = uStack_248;
        }
        uStack_248 = uVar2;
      }
    }
    if (uStack_248 != 0) {
      snprintf(str + (uStack_248 - 8),0x200 - uStack_248,"\n");
      debug_send_line(ssl,level,file,line,(char *)&bitlen);
    }
  }
  return;
}

Assistant:

void mbedtls_debug_print_mpi(const mbedtls_ssl_context *ssl, int level,
                             const char *file, int line,
                             const char *text, const mbedtls_mpi *X)
{
    char str[DEBUG_BUF_SIZE];
    size_t bitlen;
    size_t idx = 0;

    if (NULL == ssl              ||
        NULL == ssl->conf        ||
        NULL == ssl->conf->f_dbg ||
        NULL == X                ||
        level > debug_threshold) {
        return;
    }

    bitlen = mbedtls_mpi_bitlen(X);

    mbedtls_snprintf(str, sizeof(str), "value of '%s' (%u bits) is:\n",
                     text, (unsigned) bitlen);
    debug_send_line(ssl, level, file, line, str);

    if (bitlen == 0) {
        str[0] = ' '; str[1] = '0'; str[2] = '0';
        idx = 3;
    } else {
        int n;
        for (n = (int) ((bitlen - 1) / 8); n >= 0; n--) {
            size_t limb_offset = n / sizeof(mbedtls_mpi_uint);
            size_t offset_in_limb = n % sizeof(mbedtls_mpi_uint);
            unsigned char octet =
                (X->p[limb_offset] >> (offset_in_limb * 8)) & 0xff;
            mbedtls_snprintf(str + idx, sizeof(str) - idx, " %02x", octet);
            idx += 3;
            /* Wrap lines after 16 octets that each take 3 columns */
            if (idx >= 3 * 16) {
                mbedtls_snprintf(str + idx, sizeof(str) - idx, "\n");
                debug_send_line(ssl, level, file, line, str);
                idx = 0;
            }
        }
    }

    if (idx != 0) {
        mbedtls_snprintf(str + idx, sizeof(str) - idx, "\n");
        debug_send_line(ssl, level, file, line, str);
    }
}